

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall
Assimp::SMDImporter::ParseTriangle(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  pointer pFVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  byte *local_f8;
  float *local_f0 [2];
  float local_e0 [46];
  
  local_f8 = (byte *)szCurrent;
  SMD::Face::Face((Face *)local_f0);
  std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::
  emplace_back<Assimp::SMD::Face>(&this->asTriangles,(Face *)local_f0);
  SMD::Face::~Face((Face *)local_f0);
  pFVar1 = (this->asTriangles).
           super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar4 = SkipSpaces<char>(szCurrent,(char **)&local_f8);
  pbVar2 = local_f8;
  if (bVar4) {
    pbVar3 = local_f8 + 1;
    do {
      do {
        local_f8 = pbVar3;
        pbVar3 = local_f8 + 1;
      } while (0x20 < (ulong)*local_f8);
    } while ((0x100003601U >> ((ulong)*local_f8 & 0x3f) & 1) == 0);
    local_f0[0] = (float *)((long)((Face *)local_f0)->avVertices + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,pbVar2,local_f8);
    uVar5 = GetTextureIndex(this,(string *)local_f0);
    pFVar1[-1].iTexture = uVar5;
    std::__cxx11::string::~string((string *)local_f0);
    SkipSpacesAndLineEnd(this,(char *)local_f8,(char **)&local_f8);
    for (lVar6 = -0xc0; lVar6 != 0; lVar6 = lVar6 + 0x40) {
      ParseVertex(this,(char *)local_f8,(char **)&local_f8,
                  (Vertex *)((long)pFVar1->avVertices + lVar6 + -8),false);
    }
    *szCurrentOut = (char *)local_f8;
  }
  else {
    LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing a triangle");
  }
  return;
}

Assistant:

void SMDImporter::ParseTriangle(const char* szCurrent, const char** szCurrentOut) {
    asTriangles.push_back(SMD::Face());
    SMD::Face& face = asTriangles.back();

    if(!SkipSpaces(szCurrent,&szCurrent)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing a triangle");
        return;
    }

    // read the texture file name
    const char* szLast = szCurrent;
    while (!IsSpaceOrNewLine(*++szCurrent));

    // ... and get the index that belongs to this file name
    face.iTexture = GetTextureIndex(std::string(szLast,(uintptr_t)szCurrent-(uintptr_t)szLast));

    SkipSpacesAndLineEnd(szCurrent,&szCurrent);

    // load three vertices
    for (unsigned int iVert = 0; iVert < 3;++iVert) {
        ParseVertex(szCurrent,&szCurrent, face.avVertices[iVert]);
    }
    *szCurrentOut = szCurrent;
}